

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelNoClockAnalyzerSettings.cpp
# Opt level: O1

void __thiscall
SimpleParallelAnalyzerSettings::LoadSettings(SimpleParallelAnalyzerSettings *this,char *settings)

{
  long lVar1;
  Channel *this_00;
  ulong uVar2;
  SimpleArchive text_archive;
  char text [64];
  SimpleArchive local_a0 [8];
  Channel *local_98;
  long local_90;
  Channel local_88 [16];
  char local_78 [72];
  
  SimpleArchive::SimpleArchive(local_a0);
  SimpleArchive::SetString((char *)local_a0);
  uVar2 = (ulong)((long)(this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 4;
  if ((int)uVar2 != 0) {
    lVar1 = 0;
    do {
      SimpleArchive::operator>>
                (local_a0,(this->mDataChannels).
                          super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar1);
      lVar1 = lVar1 + 0x10;
    } while ((uVar2 & 0xffffffff) << 4 != lVar1);
  }
  local_98 = &this->mClockChannel;
  SimpleArchive::operator>>(local_a0,local_98);
  SimpleArchive::operator>>(local_a0,&this->mClockEdge);
  AnalyzerSettings::ClearChannels();
  if ((int)uVar2 != 0) {
    local_90 = (uVar2 & 0xffffffff) << 4;
    uVar2 = 0;
    lVar1 = 0;
    do {
      sprintf(local_78,"D%d",uVar2);
      this_00 = (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                super__Vector_impl_data._M_start + lVar1;
      Channel::Channel(local_88,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
      Channel::operator!=(this_00,local_88);
      AnalyzerSettings::AddChannel((Channel *)this,(char *)this_00,SUB81(local_78,0));
      Channel::~Channel(local_88);
      lVar1 = lVar1 + 0x10;
      uVar2 = (ulong)((int)uVar2 + 1);
    } while (local_90 != lVar1);
  }
  AnalyzerSettings::AddChannel((Channel *)this,(char *)local_98,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(local_a0);
  return;
}

Assistant:

void SimpleParallelAnalyzerSettings::LoadSettings( const char* settings )
{
	SimpleArchive text_archive;
	text_archive.SetString( settings );

	U32 count = (U32)mDataChannels.size();

	for( U32 i=0; i<count; i++ )
	{
		text_archive >> mDataChannels[i];
	}

	text_archive >> mClockChannel;
	text_archive >> *(U32*)&mClockEdge;

	ClearChannels();
	for( U32 i=0; i<count; i++ )
	{
		char text[64];
		sprintf( text, "D%d", i );
		AddChannel( mDataChannels[i], text, mDataChannels[i] != UNDEFINED_CHANNEL );
	}

	AddChannel( mClockChannel, "Clock", true );

	UpdateInterfacesFromSettings();
}